

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O0

void __thiscall
QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString>::~QStringBuilder
          (QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString> *this)

{
  QString::~QString((QString *)0x1d8490);
  QStringBuilder<QString,_const_char_(&)[2]>::~QStringBuilder
            ((QStringBuilder<QString,_const_char_(&)[2]> *)0x1d849a);
  return;
}

Assistant:

~QStringBuilder() = default;